

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hawktracer.c
# Opt level: O0

HT_FileDumpListener *
ht_file_dump_listener_register
          (HT_Timeline *timeline,char *filename,size_t buffer_size,HT_ErrorCode *out_err)

{
  HT_FileDumpListener *local_38;
  HT_FileDumpListener *listener;
  HT_ErrorCode *pHStack_28;
  HT_ErrorCode err;
  HT_ErrorCode *out_err_local;
  size_t buffer_size_local;
  char *filename_local;
  HT_Timeline *timeline_local;
  
  listener._4_4_ = HT_ERR_OK;
  pHStack_28 = out_err;
  out_err_local = (HT_ErrorCode *)buffer_size;
  buffer_size_local = (size_t)filename;
  filename_local = (char *)timeline;
  local_38 = ht_file_dump_listener_create
                       (filename,buffer_size,(HT_ErrorCode *)((long)&listener + 4));
  if ((local_38 != (HT_FileDumpListener *)0x0) &&
     (listener._4_4_ =
           ht_timeline_register_listener_full
                     ((HT_Timeline *)filename_local,ht_file_dump_listener_callback,local_38,
                      ht_file_dump_listener_destroy), listener._4_4_ != HT_ERR_OK)) {
    ht_file_dump_listener_destroy(local_38);
    local_38 = (HT_FileDumpListener *)0x0;
  }
  if (pHStack_28 != (HT_ErrorCode *)0x0) {
    *pHStack_28 = listener._4_4_;
  }
  return local_38;
}

Assistant:

HT_FileDumpListener*
ht_file_dump_listener_register(
        HT_Timeline* timeline, const char* filename, size_t buffer_size, HT_ErrorCode *out_err)
{
    HT_ErrorCode err = HT_ERR_OK;
    HT_FileDumpListener* listener = ht_file_dump_listener_create(filename, buffer_size, &err);

    if (!listener)
    {
        goto register_done;
    }

    err = ht_timeline_register_listener_full(
                timeline,
                ht_file_dump_listener_callback,
                listener,
                (HT_DestroyCallback)ht_file_dump_listener_destroy);
    if (err != HT_ERR_OK)
    {
        ht_file_dump_listener_destroy(listener);
        listener = NULL;
    }

register_done:
    HT_SET_ERROR(out_err, err);
    return listener;
}